

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::reconfigure(raft_server *this,ptr<cluster_config> *new_config)

{
  int32 *__args;
  value_type *__x;
  ptr<logger> *__args_3;
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  context *pcVar4;
  void *pvVar5;
  int *piVar6;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  iterator iVar12;
  undefined4 extraout_var;
  ostream *poVar13;
  long *plVar14;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *plVar15;
  element_type *peVar16;
  _List_node_base *p_Var17;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *plVar18;
  long lVar19;
  _Hash_node_base *p_Var20;
  pointer psVar21;
  char *pcVar22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  pointer piVar24;
  bool bVar25;
  bool bVar26;
  ptr<snapshot_sync_ctx> snp_ctx;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  ptr<peer> p;
  vector<int,_std::allocator<int>_> srvs_removed;
  ptr<srv_config> srv_added;
  undefined1 local_390 [24];
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  srvs_added;
  undefined1 local_358 [8];
  ptr<cluster_config> cur_config;
  stringstream str_buf2;
  __int_type_conflict1 _Stack_33c;
  undefined1 local_338 [8];
  code *local_330;
  code *local_328;
  ios_base local_2c0 [264];
  stringstream str_buf;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_1a8 [7];
  ios_base local_138 [264];
  
  get_config((raft_server *)&cur_config);
  __args_3 = &this->l_;
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar11 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar11) {
      peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      peVar2 = (new_config->super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&str_buf,
                 "new config log idx %lu, prev log idx %lu, cur config log idx %lu, prev log idx %lu"
                 ,peVar2->log_idx_,peVar2->prev_log_idx_,
                 (cur_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->log_idx_,
                 (cur_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->prev_log_idx_);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"reconfigure",0x28c,&str_buf);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_str_buf != local_1a8) {
        operator_delete(_str_buf);
      }
    }
    peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar11 = (*peVar1->_vptr_logger[7])(), 4 < iVar11)) {
      peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      peVar2 = (new_config->super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&str_buf,
                 "system is reconfigured to have %zu servers, last config index: %lu, this config index: %lu"
                 ,(peVar2->servers_).
                  super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                  ._M_impl._M_node._M_size,peVar2->prev_log_idx_,peVar2->log_idx_);
      (*peVar1->_vptr_logger[8])
                (peVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"reconfigure",0x291,&str_buf);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_str_buf != local_1a8) {
        operator_delete(_str_buf);
      }
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&str_buf);
  __args = &this->id_;
  p_Var17 = (_List_node_base *)
            &(cur_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->servers_;
  do {
    p_Var17 = (((_List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                 *)&p_Var17->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    bVar25 = p_Var17 ==
             (_List_node_base *)
             &(cur_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->servers_;
    if (bVar25) {
      plVar15 = &((new_config->
                  super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 servers_;
      plVar18 = plVar15;
      goto LAB_0021c286;
    }
  } while (*(int *)p_Var17[1]._M_next != this->id_);
  p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var17[1]._M_prev;
  if (p_Var23 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0021c26d:
    bVar25 = false;
    goto LAB_0021c2c2;
  }
  goto LAB_0021c2a3;
  while (*(int *)(plVar18->
                 super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                 )._M_impl._M_node._M_size != this->id_) {
LAB_0021c286:
    plVar18 = (list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
               *)(plVar18->
                 super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
    if (plVar18 == plVar15) goto LAB_0021c26d;
  }
  p_Var23 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(plVar18 + 1);
  if (p_Var23 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar25 = true;
    goto LAB_0021c2c2;
  }
LAB_0021c2a3:
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
LAB_0021c2c2:
  srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  srvs_added.
  super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  srvs_added.
  super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  srvs_added.
  super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  peVar2 = (new_config->super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  plVar14 = (long *)(peVar2->servers_).
                    super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
  plVar18 = &peVar2->servers_;
  if ((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
       *)plVar14 != plVar18) {
    do {
      _str_buf2 = *(undefined4 *)plVar14[2];
      iVar12 = std::
               _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(this->peers_)._M_h,(key_type_conflict *)&str_buf2);
      __x = (value_type *)(plVar14 + 2);
      iVar11 = *__args;
      peVar16 = (__x->super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((iVar12.
           super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
           _M_cur == (__node_type *)0x0) && (iVar11 != peVar16->id_)) {
        std::
        vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
        ::push_back(&srvs_added,__x);
        iVar11 = *__args;
        peVar16 = (__x->super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      }
      if (iVar11 == peVar16->id_) {
        this->my_priority_ = peVar16->priority_;
        this->steps_to_down_ = 0;
        if (((this->role_)._M_i == follower) && (((this->catching_up_)._M_base._M_i & 1U) != 0)) {
          peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
          ;
          if ((peVar1 != (element_type *)0x0) && (iVar11 = (*peVar1->_vptr_logger[7])(), 3 < iVar11)
             ) {
            peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)&str_buf2,
                       "now this node is the part of cluster, catch-up process is done, clearing the flag"
                      );
            (*peVar1->_vptr_logger[8])
                      (peVar1,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"reconfigure",0x2ac,(string *)&str_buf2);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_str_buf2 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_330) {
              operator_delete((void *)_str_buf2);
            }
          }
          LOCK();
          (this->catching_up_)._M_base._M_i = false;
          UNLOCK();
          restart_election_timer(this);
        }
      }
      plVar14 = (long *)*plVar14;
    } while ((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
              *)plVar14 != plVar18);
  }
  p_Var20 = (this->peers_)._M_h._M_before_begin._M_nxt;
  if (p_Var20 != (_Hash_node_base *)0x0) {
    do {
      plVar15 = &((new_config->
                  super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 servers_;
      plVar18 = plVar15;
      do {
        plVar18 = (list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                   *)(plVar18->
                     super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                     )._M_impl._M_node.super__List_node_base._M_next;
        if (plVar18 == plVar15) {
          if (srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&srvs_removed,
                       (iterator)
                       srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)(p_Var20 + 1));
          }
          else {
            *srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish = *(int *)&p_Var20[1]._M_nxt;
            srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          goto LAB_0021c4ae;
        }
      } while (*(int *)(plVar18->
                       super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                       )._M_impl._M_node._M_size != *(int *)&p_Var20[1]._M_nxt);
      p_Var23 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(plVar18 + 1);
      if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
      }
LAB_0021c4ae:
      p_Var20 = p_Var20->_M_nxt;
    } while (p_Var20 != (_Hash_node_base *)0x0);
  }
  local_390._16_8_ = &this->peers_;
  plVar15 = &((new_config->super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->servers_;
  plVar18 = plVar15;
  do {
    plVar18 = (list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
               *)(plVar18->
                 super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
    if (plVar18 == plVar15) {
      if (srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_finish ==
          srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&srvs_removed,
                   (iterator)
                   srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,__args);
      }
      else {
        *srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = *__args;
        srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      goto LAB_0021c53d;
    }
  } while (*(int *)(plVar18->
                   super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                   )._M_impl._M_node._M_size != *__args);
  p_Var23 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(plVar18 + 1);
  if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
  }
LAB_0021c53d:
  if (srvs_added.
      super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      srvs_added.
      super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar21 = srvs_added.
              super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      srv_added.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar21->super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      srv_added.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (psVar21->super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
      if (srv_added.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (srv_added.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (srv_added.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (srv_added.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (srv_added.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_338 = (undefined1  [8])0x0;
      _str_buf2 = operator_new(0x18);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_str_buf2)->_vptr__Sp_counted_base =
           (_func_int **)handle_hb_timeout;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_str_buf2)->_M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_str_buf2)->_M_weak_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(_str_buf2 + 0x10))->_vptr__Sp_counted_base =
           (_func_int **)this;
      local_328 = std::
                  _Function_handler<void_(int),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>))(int)>_>
                  ::_M_invoke;
      local_330 = std::
                  _Function_handler<void_(int),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>))(int)>_>
                  ::_M_manager;
      p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<nuraft::peer,std::allocator<nuraft::peer>,std::shared_ptr<nuraft::srv_config>&,nuraft::context&,std::function<void(int)>&,std::shared_ptr<nuraft::logger>&>
                (&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (peer **)&p,(allocator<nuraft::peer> *)&snp_ctx,&srv_added,
                 (this->ctx_)._M_t.
                 super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
                 super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
                 super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl,
                 (function<void_(int)> *)&str_buf2,__args_3);
      peVar3 = p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar11 = (*((this->log_store_).
                  super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_log_store[2])();
      LOCK();
      (peVar3->next_log_idx_).super___atomic_base<unsigned_long>._M_i =
           CONCAT44(extraout_var,iVar11);
      UNLOCK();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"add peer ",9);
      poVar13 = (ostream *)
                std::ostream::operator<<
                          (local_1a8,
                           (srv_added.
                            super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->id_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,((srv_added.
                                     super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->endpoint_)._M_dataplus._M_p,
                           ((srv_added.
                             super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->endpoint_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
      bVar26 = (srv_added.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->learner_ != false;
      pcVar22 = "voting member";
      if (bVar26) {
        pcVar22 = "learner";
      }
      lVar19 = 0xd;
      if (bVar26) {
        lVar19 = 7;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar22,lVar19);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(snp_ctx.
                    super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    ._4_4_,(srv_added.
                            super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->id_);
      snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_3d8._M_allocated_capacity =
           (size_type)
           p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ._M_pi)->_M_use_count + 1;
        }
      }
      std::
      _Hashtable<int,std::pair<int_const,std::shared_ptr<nuraft::peer>>,std::allocator<std::pair<int_const,std::shared_ptr<nuraft::peer>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<int,std::shared_ptr<nuraft::peer>>>
                ((_Hashtable<int,std::pair<int_const,std::shared_ptr<nuraft::peer>>,std::allocator<std::pair<int_const,std::shared_ptr<nuraft::peer>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_390._16_8_,(allocator<nuraft::peer> *)&snp_ctx);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._M_allocated_capacity !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._M_allocated_capacity);
      }
      peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar1 != (element_type *)0x0) && (iVar11 = (*peVar1->_vptr_logger[7])(), 3 < iVar11)) {
        peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&snp_ctx,"server %d is added to cluster",
                   (ulong)(uint)(srv_added.
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->id_);
        (*peVar1->_vptr_logger[8])
                  (peVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"reconfigure",0x2d4,(allocator<nuraft::peer> *)&snp_ctx);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr != &local_3d8) {
          operator_delete(snp_ctx.
                          super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
        }
      }
      if ((this->role_)._M_i == leader) {
        LOCK();
        ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        suppress_following_error_)._M_base._M_i = true;
        UNLOCK();
        peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if ((peVar1 != (element_type *)0x0) && (iVar11 = (*peVar1->_vptr_logger[7])(), 3 < iVar11))
        {
          peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
          ;
          msg_if_given_abi_cxx11_
                    ((string *)&snp_ctx,"enable heartbeating for server %d",
                     (ulong)(uint)(srv_added.
                                   super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->id_);
          (*peVar1->_vptr_logger[8])
                    (peVar1,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"reconfigure",0x2d8,(allocator<nuraft::peer> *)&snp_ctx);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr != &local_3d8) {
            operator_delete(snp_ctx.
                            super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
          }
        }
        enable_hb_for_peer(this,p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
        peVar3 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if ((peVar3 != (element_type *)0x0) &&
           (((peVar3->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->id_ ==
            (((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->config_).
             super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_)) {
          LOCK();
          ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->next_log_idx_).
          super___atomic_base<unsigned_long>._M_i =
               (peVar3->next_log_idx_).super___atomic_base<unsigned_long>._M_i;
          UNLOCK();
          p_Var23 = (this->srv_to_join_).
                    super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
          }
        }
      }
      if (p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
      if (local_330 != (code *)0x0) {
        (*local_330)((function<void_(int)> *)&str_buf2,(function<void_(int)> *)&str_buf2,3);
      }
      if (srv_added.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (srv_added.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      psVar21 = psVar21 + 1;
    } while (psVar21 !=
             srvs_added.
             super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar24 = srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                    *piVar24);
      if ((*piVar24 == *__args) && (((this->catching_up_)._M_base._M_i & 1U) == 0)) {
        peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if ((peVar1 != (element_type *)0x0) && (iVar11 = (*peVar1->_vptr_logger[7])(), 3 < iVar11))
        {
          peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
          ;
          msg_if_given_abi_cxx11_
                    ((string *)&str_buf2,
                     "this server (%d) has been removed from the cluster, will step down itself soon. config log idx %lu"
                     ,(ulong)(uint)*__args,
                     ((new_config->
                      super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                     )->log_idx_);
          (*peVar1->_vptr_logger[8])
                    (peVar1,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"reconfigure",0x2e9,(element_type *)&str_buf2);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_str_buf2 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_330) {
            operator_delete((void *)_str_buf2);
          }
        }
        _Stack_33c = (this->leader_).super___atomic_base<int>._M_i;
        _str_buf2 = this->id_;
        local_338._0_4_ = 0xffffffff;
        local_330 = (code *)0x0;
        pcVar4 = (this->ctx_)._M_t.
                 super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
                 super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
                 super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
        if ((pcVar4->cb_func_).func.super__Function_base._M_manager != (_Manager_type)0x0) {
          srv_added.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               CONCAT44(srv_added.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._4_4_,10);
          snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&str_buf2;
          (*(pcVar4->cb_func_).func._M_invoker)
                    ((_Any_data *)&pcVar4->cb_func_,(Type *)&srv_added,(Param **)&snp_ctx);
        }
        this->steps_to_down_ = 2;
      }
      iVar12 = std::
               _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find((_Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)local_390._16_8_,(key_type_conflict *)&p);
      if (iVar12.
          super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
          _M_cur == (__node_type *)0x0) {
        peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if ((peVar1 != (element_type *)0x0) && (iVar11 = (*peVar1->_vptr_logger[7])(), 3 < iVar11))
        {
          peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
          ;
          msg_if_given_abi_cxx11_
                    ((string *)&str_buf2,"peer %d cannot be found, no action for removing",
                     (ulong)p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
                     0xffffffff);
          (*peVar1->_vptr_logger[8])
                    (peVar1,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"reconfigure",0x332,(element_type *)&str_buf2);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_str_buf2 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_330) {
            operator_delete((void *)_str_buf2);
          }
        }
      }
      else {
        peVar3 = (this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (peVar3 == (element_type *)0x0 || (this->role_)._M_i != leader) {
          if (((peVar3 == (element_type *)0x0) &&
              (peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr, peVar1 != (element_type *)0x0)) &&
             (iVar11 = (*peVar1->_vptr_logger[7])(), 3 < iVar11)) {
            peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)&str_buf2,
                       "srv_to_leave_ is currently empty on config for removing %d",
                       (ulong)(uint)((((((ptr<peer> *)
                                        ((long)iVar12.
                                               super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                                               ._M_cur + 0x10))->
                                       super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)
                                      ._M_ptr)->config_).
                                     super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->id_);
            (*peVar1->_vptr_logger[8])
                      (peVar1,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"reconfigure",0x32b,(element_type *)&str_buf2);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_str_buf2 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_330) {
              operator_delete((void *)_str_buf2);
            }
          }
          remove_peer_from_peers
                    (this,(ptr<peer> *)
                          ((long)iVar12.
                                 super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                                 ._M_cur + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"remove peer ",0xc);
          plVar14 = (long *)std::ostream::operator<<
                                      (local_1a8,
                                       (int)p.
                                            super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr);
          std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
          std::ostream::put((char)plVar14);
          std::ostream::flush();
        }
        else {
          peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
          ;
          if (peVar1 != (element_type *)0x0) {
            iVar11 = (*peVar1->_vptr_logger[7])();
            if (3 < iVar11) {
              peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              msg_if_given_abi_cxx11_
                        ((string *)&str_buf2,"srv_to_leave_: %d",
                         (ulong)(uint)((((this->srv_to_leave_).
                                         super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->config_).
                                       super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->id_);
              (*peVar1->_vptr_logger[8])
                        (peVar1,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                         ,"reconfigure",0x319,(element_type *)&str_buf2);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_str_buf2 !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_330) {
                operator_delete((void *)_str_buf2);
              }
            }
          }
          peer::get_snapshot_sync_ctx((peer *)&snp_ctx);
          if (snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (element_type *)0x0) {
            peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            if (peVar1 != (element_type *)0x0) {
              pvVar5 = (snp_ctx.
                        super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->user_snp_ctx_;
              iVar11 = (*peVar1->_vptr_logger[7])();
              if (3 < iVar11) {
                peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr;
                msg_if_given_abi_cxx11_
                          ((string *)&str_buf2,
                           "srv_to_leave_ has snapshot context %p and user context %p, destroy them"
                           ,snp_ctx.
                            super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,pvVar5);
                (*peVar1->_vptr_logger[8])
                          (peVar1,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                           ,"reconfigure",799,(element_type *)&str_buf2);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_str_buf2 !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_330) {
                  operator_delete((void *)_str_buf2);
                }
              }
            }
            clear_snapshot_sync_ctx
                      (this,(this->srv_to_leave_).
                            super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          if (snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (snp_ctx.
                       super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
      }
      piVar24 = piVar24 + 1;
    } while (piVar24 !=
             srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__cxx11::stringbuf::str();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_str_buf2 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_330) {
    operator_delete((void *)_str_buf2);
  }
  if (((local_338 != (undefined1  [8])0x0) &&
      (peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
      peVar1 != (element_type *)0x0)) && (iVar11 = (*peVar1->_vptr_logger[7])(), 3 < iVar11)) {
    peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::stringbuf::str();
    msg_if_given_abi_cxx11_
              ((string *)&str_buf2,"%s",
               snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    (*peVar1->_vptr_logger[8])
              (peVar1,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
               ,"reconfigure",0x337,&str_buf2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_str_buf2 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_330) {
      operator_delete((void *)_str_buf2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != &local_3d8) {
      operator_delete(snp_ctx.
                      super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
    }
  }
  set_config(this,new_config);
  peVar2 = (this->uncommitted_config_).
           super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar2 != (element_type *)0x0) &&
     (peVar2->log_idx_ ==
      ((new_config->super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
      ->log_idx_)) {
    peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar11 = (*peVar1->_vptr_logger[7])(), 3 < iVar11)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar2 = (this->uncommitted_config_).
               super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&str_buf2,"clearing uncommitted config at log %lu, prev %lu",
                 peVar2->log_idx_,peVar2->prev_log_idx_);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"reconfigure",0x341,&str_buf2);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_str_buf2 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_330) {
        operator_delete((void *)_str_buf2);
      }
    }
    p_Var23 = (this->uncommitted_config_).
              super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (this->uncommitted_config_).
    super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->uncommitted_config_).
    super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
    }
  }
  if (bVar25) {
    _Stack_33c = (this->leader_).super___atomic_base<int>._M_i;
    _str_buf2 = this->id_;
    local_330 = (code *)0x0;
    get_config((raft_server *)&snp_ctx);
    local_330 = (code *)snp_ctx.
                        super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
    pcVar4 = (this->ctx_)._M_t.
             super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
             super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
             super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
    if ((pcVar4->cb_func_).func.super__Function_base._M_manager != (_Manager_type)0x0) {
      p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,5);
      srv_added.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&str_buf2;
      (*(pcVar4->cb_func_).func._M_invoker)
                ((_Any_data *)&pcVar4->cb_func_,(Type *)&p,(Param **)&srv_added);
    }
    if (snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&str_buf2);
  plVar15 = &((new_config->super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->servers_;
  plVar18 = plVar15;
  do {
    plVar18 = (list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
               *)(plVar18->
                 super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
    if (plVar18 == plVar15) {
      peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar1 != (element_type *)0x0) && (iVar11 = (*peVar1->_vptr_logger[7])(), 3 < iVar11)) {
        peVar1 = (__args_3->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        peVar2 = (new_config->super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        uVar9 = peVar2->log_idx_;
        uVar10 = peVar2->prev_log_idx_;
        std::__cxx11::stringbuf::str();
        msg_if_given_abi_cxx11_
                  ((string *)&snp_ctx,
                   "new configuration: log idx %lu, prev log idx %lu\n%smy id: %d, leader: %d, term: %lu"
                   ,uVar9,uVar10,
                   srv_added.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(ulong)(uint)this->id_,
                   (ulong)(uint)(this->leader_).super___atomic_base<int>._M_i,
                   (((this->state_).
                     super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   term_).super___atomic_base<unsigned_long>._M_i);
        (*peVar1->_vptr_logger[8])
                  (peVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"reconfigure",0x364,&snp_ctx);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr != &local_3d8) {
          operator_delete(snp_ctx.
                          super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
        }
        if (srv_added.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)local_390) {
          operator_delete(srv_added.
                          super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
        }
      }
      update_target_priority(this);
      std::__cxx11::stringstream::~stringstream((stringstream *)&str_buf2);
      std::ios_base::~ios_base(local_2c0);
      std::
      vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
      ::~vector(&srvs_added);
      if (srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&str_buf);
      std::ios_base::~ios_base(local_138);
      if (cur_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (cur_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      return;
    }
    piVar6 = (int *)(plVar18->
                    super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                    )._M_impl._M_node._M_size;
    for (p_Var20 = (this->peers_)._M_h._M_before_begin._M_nxt; p_Var20 != (_Hash_node_base *)0x0;
        p_Var20 = p_Var20->_M_nxt) {
      p_Var7 = p_Var20[2]._M_nxt;
      iVar11 = pthread_mutex_lock((pthread_mutex_t *)(p_Var7 + 0x1b));
      if (iVar11 != 0) {
        std::__throw_system_error(iVar11);
      }
      if (*(int *)&p_Var7->_M_nxt->_M_nxt == *piVar6) {
        p_Var8 = (_Hash_node_base *)
                 (plVar18->
                 super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                 )._M_impl._M_node._M_size;
        local_358 = *(undefined1 (*) [8])(plVar18 + 1);
        if (local_358 != (undefined1  [8])0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)((long)local_358 + 8U) = *(int *)((long)local_358 + 8U) + 1;
            UNLOCK();
          }
          else {
            *(int *)((long)local_358 + 8U) = *(int *)((long)local_358 + 8U) + 1;
          }
        }
        p_Var7->_M_nxt = p_Var8;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var7 + 1),
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_358);
        if (local_358 != (undefined1  [8])0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358);
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)(p_Var7 + 0x1b));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"peer ",5);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&local_330,*piVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,", DC ID ",8);
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,piVar6[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,*(char **)(piVar6 + 2),*(long *)(piVar6 + 4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
    bVar25 = (char)piVar6[0x12] != '\0';
    pcVar22 = "voting member";
    if (bVar25) {
      pcVar22 = "learner";
    }
    lVar19 = 0xd;
    if (bVar25) {
      lVar19 = 7;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar22,lVar19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
    plVar14 = (long *)std::ostream::operator<<(poVar13,piVar6[0x13]);
    std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
    std::ostream::put((char)plVar14);
    std::ostream::flush();
  } while( true );
}

Assistant:

void raft_server::reconfigure(const ptr<cluster_config>& new_config) {
    ptr<cluster_config> cur_config = get_config();
    p_in( "new config log idx %" PRIu64 ", prev log idx %" PRIu64 ", "
          "cur config log idx %" PRIu64 ", prev log idx %" PRIu64,
          new_config->get_log_idx(), new_config->get_prev_log_idx(),
          cur_config->get_log_idx(), cur_config->get_prev_log_idx() );
    p_db( "system is reconfigured to have %zu servers, "
          "last config index: %" PRIu64 ", this config index: %" PRIu64 "",
          new_config->get_servers().size(),
          new_config->get_prev_log_idx(),
          new_config->get_log_idx() );

    std::stringstream str_buf;

    // Compare old and new configs, to check if
    // the configuration change is for adding this node.
    bool invoke_join_cb =
        ( !cur_config->get_server(id_) && new_config->get_server(id_) );

    // we only allow one server to be added or removed at a time
    std::vector<int32> srvs_removed;
    std::vector< ptr<srv_config> > srvs_added;
    std::list< ptr<srv_config> >& new_srvs(new_config->get_servers());
    for ( std::list<ptr<srv_config>>::const_iterator it = new_srvs.begin();
          it != new_srvs.end(); ++it ) {
        peer_itor pit = peers_.find((*it)->get_id());
        if (pit == peers_.end() && id_ != (*it)->get_id()) {
            srvs_added.push_back(*it);
        }
        if (id_ == (*it)->get_id()) {
            my_priority_ = (*it)->get_priority();
            steps_to_down_ = 0;
            if (role_ == srv_role::follower &&
                catching_up_) {
                // If this node is newly added, start election timer
                // without waiting for the next append_entries message.
                p_in("now this node is the part of cluster, "
                     "catch-up process is done, clearing the flag");
                catching_up_ = false;
                restart_election_timer();
            }
        }
    }

    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        if (!new_config->get_server(it->first)) {
            srvs_removed.push_back(it->first);
        }
    }

    if (!new_config->get_server(id_)) {
        srvs_removed.push_back(id_);
    }

    // ===== Adding new server =====
    for ( std::vector<ptr<srv_config>>::const_iterator it = srvs_added.begin();
          it != srvs_added.end(); ++it ) {
        ptr<srv_config> srv_added = *it;
        timer_task<int32>::executor exec =
            (timer_task<int32>::executor)
            std::bind( &raft_server::handle_hb_timeout,
                       this,
                       std::placeholders::_1 );
        ptr<peer> p = cs_new< peer,
                              ptr<srv_config>&,
                              context&,
                              timer_task<int32>::executor&,
                              ptr<logger>& >
                            ( srv_added, *ctx_, exec, l_ );
        p->set_next_log_idx(log_store_->next_slot());

        str_buf << "add peer " << srv_added->get_id()
                << ", " << srv_added->get_endpoint()
                << ", " << (srv_added->is_learner() ? "learner" : "voting member")
                << std::endl;

        peers_.insert(std::make_pair(srv_added->get_id(), p));
        p_in("server %d is added to cluster", srv_added->get_id());
        if (role_ == srv_role::leader) {
            // Suppress following RPC error as it is expected.
            p->set_suppress_following_error();
            p_in("enable heartbeating for server %d", srv_added->get_id());
            enable_hb_for_peer(*p);
            if (srv_to_join_ && srv_to_join_->get_id() == p->get_id()) {
                p->set_next_log_idx(srv_to_join_->get_next_log_idx());
                srv_to_join_.reset();
            }
        }
    }

    // ===== Removing server =====
    for ( std::vector<int32>::const_iterator it = srvs_removed.begin();
          it != srvs_removed.end(); ++it ) {
        int32 srv_removed = *it;
        if (srv_removed == id_ && !catching_up_) {
            p_in("this server (%d) has been removed from the cluster, "
                 "will step down itself soon. config log idx %" PRIu64,
                 id_,
                 new_config->get_log_idx());
            // this server is removed from cluster

            // Modified by Jung-Sang Ahn (Oct 25, 2017):
            // Reset cluster config and remove all other peer info.
            // If not, this server will repeatedly request leader
            // election of the cluster that this server doesn't belong
            // to anymore.

            // Modified by Jung-Sang Ahn (Dec 24, 2019):
            // Now we have a persistent flag for election timer,
            // we don't need to append any dummy config log at the end,
            // for the case re-joining this replica to the original cluster.
            //reset_peer_info();

            cb_func::Param param(id_, leader_);
            CbReturnCode rc = ctx_->cb_func_.call( cb_func::RemovedFromCluster,
                                                   &param );
            (void)rc;
            steps_to_down_ = 2;
        }

        peer_itor pit = peers_.find(srv_removed);
        if (pit != peers_.end()) {
            // WARNING:
            //   We should not remove the peer from the list immediately,
            //   due to the issue described below:
            //
            // 0) Let's suppose there are 3 servers: S1, S2, and S3,
            //    where S1 is the leader and S3 is going to leave.
            // 1) Generate a conf log for removing server S3.
            // 2) The conf log is committed by S1 and S2 only.
            // 3) Before delivering the conf log to S3, S1 removes
            //    the S3 peer info from the list.
            // 4) It closes the connection to S3.
            // 5) S3 cannot commit the config (containing removing S3).
            // 6) Callback function for `RemovedFromCluster` will be missing,
            //    but S3 will step down itself after 2 timeout period.
            //
            // To address it, we will remove S3 only after the commit index
            // of the last config is delivered to S3.
            // Also we will have timeout for it. If we fail to deliver the
            // commit index, S3 will be just force removed.
            const ptr<peer>& pp = pit->second;

            if (role_ == srv_role::leader && srv_to_leave_) {
                // If leader, keep the to-be-removed server in peer list
                // until 1) catch-up is done, or 2) timeout.
                p_in("srv_to_leave_: %d", srv_to_leave_->get_id());
                ptr<snapshot_sync_ctx> snp_ctx = srv_to_leave_->get_snapshot_sync_ctx();
                if (snp_ctx) {
                    void* user_ctx = snp_ctx->get_user_snp_ctx();
                    p_in("srv_to_leave_ has snapshot context %p and user context %p, "
                         "destroy them",
                         snp_ctx.get(), user_ctx);
                    clear_snapshot_sync_ctx(*srv_to_leave_);
                }

                // However, if `srv_to_leave_` is NULL,
                // it is replaying old config. We can remove it
                // immediately without setting `srv_to_leave_`.

            } else {
                if (!srv_to_leave_) {
                    p_in("srv_to_leave_ is currently empty "
                         "on config for removing %d",
                         pp->get_id());
                }
                remove_peer_from_peers(pp);

                str_buf << "remove peer " << srv_removed << std::endl;
            }
        } else {
            p_in("peer %d cannot be found, no action for removing", srv_removed);
        }
    }

    if (!str_buf.str().empty()) {
        p_in("%s", str_buf.str().c_str());
    }

    set_config(new_config);

    if ( uncommitted_config_ &&
         uncommitted_config_->get_log_idx() == new_config->get_log_idx() ) {
        // All configs are committed.
        p_in("clearing uncommitted config at log %" PRIu64 ", prev %" PRIu64,
             uncommitted_config_->get_log_idx(),
             uncommitted_config_->get_prev_log_idx());
        uncommitted_config_.reset();
    }

    if (invoke_join_cb) {
        cb_func::Param param(id_, leader_);
        ptr<cluster_config> c_conf = get_config();
        param.ctx = (void*)c_conf.get();
        CbReturnCode rc = ctx_->cb_func_.call(cb_func::JoinedCluster, &param);
        (void)rc;
    }

    std::stringstream str_buf2;
    for (auto& entry: new_config->get_servers()) {
        srv_config* s_conf = entry.get();

        // SHOULD update peer's srv_config.
        for (auto& entry_peer: peers_) {
            peer* pp = entry_peer.second.get();
            std::lock_guard<std::mutex> l(pp->get_lock());
            if (pp->get_id() == s_conf->get_id()) {
                pp->set_config(entry);
            }
        }

        str_buf2 << "peer " << s_conf->get_id()
                 << ", DC ID " << s_conf->get_dc_id()
                 << ", " << s_conf->get_endpoint()
                 << ", " << (s_conf->is_learner() ? "learner" : "voting member")
                 << ", " << s_conf->get_priority()
                 << std::endl;
    }
    p_in("new configuration: log idx %" PRIu64 ", prev log idx %" PRIu64 "\n"
         "%smy id: %d, leader: %d, term: %" PRIu64,
         new_config->get_log_idx(), new_config->get_prev_log_idx(),
         str_buf2.str().c_str(), id_, leader_.load(), state_->get_term());

    update_target_priority();
}